

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O2

double __thiscall
hungarian_algorithm::HungarianSolver<double,unsigned_long,std::less<double>>::
getAssignment<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (HungarianSolver<double,unsigned_long,std::less<double>> *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *cost_function,vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  ulong j;
  const_reference pdVar1;
  size_t row;
  ulong i;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  assignment_map_adapter;
  double local_30;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  AssignmentMapAdapter(&local_28,assignment_map,*(unsigned_long *)this,*(unsigned_long *)(this + 8))
  ;
  local_30 = *(double *)(this + 0xe0);
  for (i = 0; i < *(ulong *)this; i = i + 1) {
    j = hungarian_algorithm::HungarianSolverBase::findInRow((vector *)this,(ulong)(this + 0x88));
    if (j < *(ulong *)(this + 8)) {
      ((local_28.assignment_map_)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      )._M_impl.super__Vector_impl_data._M_start[i] = j;
      pdVar1 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()(cost_function,i,j);
      local_30 = local_30 + *pdVar1;
    }
  }
  return local_30;
}

Assistant:

Cost getAssignment(const CostFunction& cost_function, AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, num_rows_, num_cols_);
    Cost total_cost(zero_cost_);
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col(findInRow(star_matrix_, row));
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
        total_cost += cost_function(Size(row), Size(col));
      }
    }
    return total_cost;
  }